

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanhelp.c
# Opt level: O3

char * mk_string(char *s,int len)

{
  char *pcVar1;
  char *extraout_RAX;
  long lVar2;
  int iVar3;
  
  lVar2 = (long)charptr;
  iVar3 = charptr + len + 1;
  if (iVar3 < 0x1389) {
    charptr = iVar3;
    pcVar1 = strncpy(charpool + lVar2,s,(long)(len + 1));
    return pcVar1;
  }
  mk_string();
  reset_scanner();
  nodeptr = 0;
  return extraout_RAX;
}

Assistant:

static char *string_alloc(int len)
{
   char *s;

   if(charptr + len > MAXCHAR){
      fprintf(stderr, "out of memory\n");
      exit(1);
   }

   s = charpool + charptr;
   charptr += len;

   return s;
}